

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.c
# Opt level: O0

void * kmpc_malloc(size_t size)

{
  void *ptr;
  bufsize in_stack_00000060;
  kmp_info_t *in_stack_00000068;
  undefined8 local_10;
  
  __kmp_entry_thread();
  local_10 = bget(in_stack_00000068,in_stack_00000060);
  if (local_10 != (void *)0x0) {
    *(void **)local_10 = local_10;
    local_10 = (void *)((long)local_10 + 8);
  }
  return local_10;
}

Assistant:

void *
kmpc_malloc( size_t size )
{
    void * ptr;
    ptr = bget( __kmp_entry_thread(), (bufsize)(size + sizeof(ptr)) );
    if( ptr != NULL ) {
        // save allocated pointer just before one returned to user
        *(void**)ptr = ptr;
        ptr = (void**)ptr + 1;
    }
    return ptr;
}